

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O0

parser_error parse_monster_spells(parser *p)

{
  _Bool _Var1;
  errr eVar2;
  void *pvVar3;
  char *pcVar4;
  char *str;
  bitflag local_4e [8];
  bitflag test_flags [13];
  bitflag current_flags [13];
  wchar_t ret;
  char *s;
  char *flags;
  monster_race *r;
  parser *p_local;
  
  pvVar3 = parser_priv(p);
  current_flags[5] = '\0';
  current_flags[6] = '\0';
  current_flags[7] = '\0';
  current_flags[8] = '\0';
  if (pvVar3 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    pcVar4 = parser_getstr(p,"spells");
    pcVar4 = string_make(pcVar4);
    register0x00000000 = strtok(pcVar4," |");
    while (stack0xffffffffffffffd0 != (char *)0x0) {
      eVar2 = grab_flag((bitflag *)((long)pvVar3 + 0x68),0xd,r_info_spell_flags,
                        stack0xffffffffffffffd0);
      if (eVar2 != 0) {
        str = format("bad monster spell flag: %s",stack0xffffffffffffffd0);
        plog(str);
        current_flags[5] = '\r';
        current_flags[6] = '\0';
        current_flags[7] = '\0';
        current_flags[8] = '\0';
        break;
      }
      register0x00000000 = strtok((char *)0x0," |");
    }
    create_mon_spell_mask(test_flags + 5,0x800,0);
    flag_inter(test_flags + 5,(bitflag *)((long)pvVar3 + 0x68),0xd);
    _Var1 = flag_is_empty(test_flags + 5,0xd);
    if ((!_Var1) && (*(int *)((long)pvVar3 + 0x50) == 0)) {
      *(undefined4 *)((long)pvVar3 + 0x50) = 4;
    }
    flag_copy(test_flags + 5,(bitflag *)((long)pvVar3 + 0x68),0xd);
    create_mon_spell_mask(local_4e,4,0x800,0);
    flag_diff(test_flags + 5,local_4e,0xd);
    _Var1 = flag_is_empty(test_flags + 5,0xd);
    if ((!_Var1) && (*(int *)((long)pvVar3 + 0x54) == 0)) {
      *(undefined4 *)((long)pvVar3 + 0x54) = 4;
    }
    string_free(pcVar4);
    p_local._4_1_ = current_flags[5];
    p_local._5_1_ = current_flags[6];
    p_local._6_1_ = current_flags[7];
    p_local._7_1_ = current_flags[8];
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_monster_spells(struct parser *p) {
	struct monster_race *r = parser_priv(p);
	char *flags;
	char *s;
	int ret = PARSE_ERROR_NONE;
	bitflag current_flags[RSF_SIZE], test_flags[RSF_SIZE];

	if (!r)
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	flags = string_make(parser_getstr(p, "spells"));
	s = strtok(flags, " |");
	while (s) {
		if (grab_flag(r->spell_flags, RSF_SIZE, r_info_spell_flags, s)) {
			plog(format("bad monster spell flag: %s", s));
			ret = PARSE_ERROR_INVALID_FLAG;
			break;
		}
		s = strtok(NULL, " |");
	}

	/* Make sure innate frequency is set if necessary */
	create_mon_spell_mask(current_flags, RST_INNATE, RST_NONE);
	rsf_inter(current_flags, r->spell_flags);
	if (!rsf_is_empty(current_flags) && !r->freq_innate) {
		/* Set frequency to the lowest found value */
		r->freq_innate = 4;
	}

	/* Make sure non-innate frequency is set if necessary */
	rsf_copy(current_flags, r->spell_flags);
	create_mon_spell_mask(test_flags, RST_BREATH, RST_INNATE, RST_NONE);
	rsf_diff(current_flags, test_flags);
	if (!rsf_is_empty(current_flags) && !r->freq_spell) {
		/* Set frequency to the lowest found value */
		r->freq_spell = 4;
	}

	string_free(flags);
	return ret;
}